

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

ScriptPtr * __thiscall FBehavior::FindScript(FBehavior *this,int script)

{
  int iVar1;
  ScriptPtr *pSVar2;
  ScriptPtr *in_RAX;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  pSVar2 = this->Scripts;
  iVar3 = this->NumScripts + -1;
  iVar5 = 0;
  do {
    if (iVar3 < iVar5) {
      in_RAX = (ScriptPtr *)0x0;
      break;
    }
    uVar4 = (uint)(iVar3 + iVar5) >> 1;
    iVar1 = pSVar2[uVar4].Number;
    if (iVar1 == script) {
      in_RAX = pSVar2 + uVar4;
    }
    else if (iVar1 < script) {
      iVar5 = uVar4 + 1;
    }
    else {
      iVar3 = uVar4 - 1;
    }
  } while (iVar1 != script);
  if ((pSVar2 < in_RAX) && (in_RAX[-1].Number == script)) {
    in_RAX = in_RAX + -1;
  }
  return in_RAX;
}

Assistant:

const ScriptPtr *FBehavior::FindScript (int script) const
{
	const ScriptPtr *ptr = BinarySearch<ScriptPtr, int>
		((ScriptPtr *)Scripts, NumScripts, &ScriptPtr::Number, script);

	// If the preceding script has the same number, return it instead.
	// See the note by the script sorting above for why.
	if (ptr > Scripts)
	{
		if (ptr[-1].Number == script)
		{
			ptr--;
		}
	}
	return ptr;
}